

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler_sse.cc
# Opt level: O0

float webrtc::SincResampler::Convolve_SSE
                (float *input_ptr,float *k1,float *k2,double kernel_interpolation_factor)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  ulong uStack_2e8;
  float result;
  size_t i_1;
  size_t i;
  __m128 m_sums2;
  __m128 m_sums1;
  __m128 m_input;
  double kernel_interpolation_factor_local;
  float *k2_local;
  float *k1_local;
  float *input_ptr_local;
  float local_208;
  float fStack_204;
  float local_1c8;
  float fStack_1c4;
  float local_188;
  float fStack_184;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  
  m_sums2[2] = 0.0;
  m_sums2[3] = 0.0;
  m_sums1[0] = 0.0;
  m_sums1[1] = 0.0;
  i = 0;
  m_sums2[0] = 0.0;
  m_sums2[1] = 0.0;
  if (((ulong)input_ptr & 0xf) == 0) {
    for (uStack_2e8 = 0; uStack_2e8 < 0x20; uStack_2e8 = uStack_2e8 + 4) {
      uVar1 = *(undefined8 *)(input_ptr + uStack_2e8);
      uVar2 = *(undefined8 *)(input_ptr + uStack_2e8 + 2);
      uVar3 = *(undefined8 *)(k1 + uStack_2e8);
      uVar4 = *(undefined8 *)(k1 + uStack_2e8 + 2);
      local_128 = (float)uVar1;
      fStack_124 = (float)((ulong)uVar1 >> 0x20);
      fStack_120 = (float)uVar2;
      fStack_11c = (float)((ulong)uVar2 >> 0x20);
      local_138 = (float)uVar3;
      fStack_134 = (float)((ulong)uVar3 >> 0x20);
      fStack_130 = (float)uVar4;
      fStack_12c = (float)((ulong)uVar4 >> 0x20);
      m_sums2[2] = m_sums2[2] + local_128 * local_138;
      m_sums2[3] = m_sums2[3] + fStack_124 * fStack_134;
      m_sums1[0] = m_sums1[0] + fStack_120 * fStack_130;
      m_sums1[1] = m_sums1[1] + fStack_11c * fStack_12c;
      uVar1 = *(undefined8 *)(k2 + uStack_2e8);
      uVar2 = *(undefined8 *)(k2 + uStack_2e8 + 2);
      local_158 = (float)uVar1;
      fStack_154 = (float)((ulong)uVar1 >> 0x20);
      fStack_150 = (float)uVar2;
      fStack_14c = (float)((ulong)uVar2 >> 0x20);
      local_208 = (float)i;
      fStack_204 = (float)(i >> 0x20);
      m_sums2[0] = m_sums2[0] + fStack_120 * fStack_150;
      m_sums2[1] = m_sums2[1] + fStack_11c * fStack_14c;
      i = CONCAT44(fStack_204 + fStack_124 * fStack_154,local_208 + local_128 * local_158);
    }
  }
  else {
    for (i_1 = 0; i_1 < 0x20; i_1 = i_1 + 4) {
      uVar1 = *(undefined8 *)(input_ptr + i_1);
      uVar2 = *(undefined8 *)(input_ptr + i_1 + 2);
      uVar3 = *(undefined8 *)(k1 + i_1);
      uVar4 = *(undefined8 *)(k1 + i_1 + 2);
      local_e8 = (float)uVar1;
      fStack_e4 = (float)((ulong)uVar1 >> 0x20);
      fStack_e0 = (float)uVar2;
      fStack_dc = (float)((ulong)uVar2 >> 0x20);
      local_f8 = (float)uVar3;
      fStack_f4 = (float)((ulong)uVar3 >> 0x20);
      fStack_f0 = (float)uVar4;
      fStack_ec = (float)((ulong)uVar4 >> 0x20);
      m_sums2[2] = m_sums2[2] + local_e8 * local_f8;
      m_sums2[3] = m_sums2[3] + fStack_e4 * fStack_f4;
      m_sums1[0] = m_sums1[0] + fStack_e0 * fStack_f0;
      m_sums1[1] = m_sums1[1] + fStack_dc * fStack_ec;
      uVar1 = *(undefined8 *)(k2 + i_1);
      uVar2 = *(undefined8 *)(k2 + i_1 + 2);
      local_118 = (float)uVar1;
      fStack_114 = (float)((ulong)uVar1 >> 0x20);
      fStack_110 = (float)uVar2;
      fStack_10c = (float)((ulong)uVar2 >> 0x20);
      local_1c8 = (float)i;
      fStack_1c4 = (float)(i >> 0x20);
      m_sums2[0] = m_sums2[0] + fStack_e0 * fStack_110;
      m_sums2[1] = m_sums2[1] + fStack_dc * fStack_10c;
      i = CONCAT44(fStack_1c4 + fStack_e4 * fStack_114,local_1c8 + local_e8 * local_118);
    }
  }
  fVar5 = (float)(1.0 - kernel_interpolation_factor);
  fVar6 = (float)kernel_interpolation_factor;
  local_188 = (float)i;
  fStack_184 = (float)(i >> 0x20);
  return m_sums1[0] * fVar5 + m_sums2[0] * fVar6 + m_sums2[2] * fVar5 + local_188 * fVar6 +
         m_sums1[1] * fVar5 + m_sums2[1] * fVar6 + m_sums2[3] * fVar5 + fStack_184 * fVar6;
}

Assistant:

float SincResampler::Convolve_SSE(const float* input_ptr, const float* k1,
                                  const float* k2,
                                  double kernel_interpolation_factor) {
  __m128 m_input;
  __m128 m_sums1 = _mm_setzero_ps();
  __m128 m_sums2 = _mm_setzero_ps();

  // Based on |input_ptr| alignment, we need to use loadu or load.  Unrolling
  // these loops hurt performance in local testing.
  if (reinterpret_cast<uintptr_t>(input_ptr) & 0x0F) {
    for (size_t i = 0; i < kKernelSize; i += 4) {
      m_input = _mm_loadu_ps(input_ptr + i);
      m_sums1 = _mm_add_ps(m_sums1, _mm_mul_ps(m_input, _mm_load_ps(k1 + i)));
      m_sums2 = _mm_add_ps(m_sums2, _mm_mul_ps(m_input, _mm_load_ps(k2 + i)));
    }
  } else {
    for (size_t i = 0; i < kKernelSize; i += 4) {
      m_input = _mm_load_ps(input_ptr + i);
      m_sums1 = _mm_add_ps(m_sums1, _mm_mul_ps(m_input, _mm_load_ps(k1 + i)));
      m_sums2 = _mm_add_ps(m_sums2, _mm_mul_ps(m_input, _mm_load_ps(k2 + i)));
    }
  }

  // Linearly interpolate the two "convolutions".
  m_sums1 = _mm_mul_ps(m_sums1, _mm_set_ps1(
      static_cast<float>(1.0 - kernel_interpolation_factor)));
  m_sums2 = _mm_mul_ps(m_sums2, _mm_set_ps1(
      static_cast<float>(kernel_interpolation_factor)));
  m_sums1 = _mm_add_ps(m_sums1, m_sums2);

  // Sum components together.
  float result;
  m_sums2 = _mm_add_ps(_mm_movehl_ps(m_sums1, m_sums1), m_sums1);
  _mm_store_ss(&result, _mm_add_ss(m_sums2, _mm_shuffle_ps(
      m_sums2, m_sums2, 1)));

  return result;
}